

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O0

bool __thiscall
sf::priv::CursorImpl::loadFromPixelsARGB
          (CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t pixelIndex;
  size_t numPixels;
  XcursorImage *cursorImage;
  ulong local_38;
  undefined4 local_10;
  undefined4 uStack_c;
  int local_8;
  int iStack_4;
  
  iStack_4 = (int)(in_RDX >> 0x20);
  lVar1 = XcursorImageCreate(in_RDX & 0xffffffff,iStack_4);
  local_10 = (undefined4)in_RCX;
  *(undefined4 *)(lVar1 + 0x10) = local_10;
  uStack_c = (undefined4)((ulong)in_RCX >> 0x20);
  *(undefined4 *)(lVar1 + 0x14) = uStack_c;
  local_8 = (int)in_RDX;
  for (local_38 = 0; local_38 < (uint)(local_8 * iStack_4); local_38 = local_38 + 1) {
    *(uint *)(*(long *)(lVar1 + 0x20) + local_38 * 4) =
         (uint)*(byte *)(in_RSI + 2 + local_38 * 4) +
         (uint)*(byte *)(in_RSI + 1 + local_38 * 4) * 0x100 +
         (uint)*(byte *)(in_RSI + local_38 * 4) * 0x10000 +
         (uint)*(byte *)(in_RSI + 3 + local_38 * 4) * 0x1000000;
  }
  uVar2 = XcursorImageLoadCursor(*in_RDI,lVar1);
  in_RDI[1] = uVar2;
  XcursorImageDestroy(lVar1);
  return true;
}

Assistant:

bool CursorImpl::loadFromPixelsARGB(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    // Create cursor image, convert from RGBA to ARGB.
    XcursorImage* cursorImage = XcursorImageCreate(static_cast<int>(size.x), static_cast<int>(size.y));
    cursorImage->xhot = hotspot.x;
    cursorImage->yhot = hotspot.y;

    const std::size_t numPixels = size.x * size.y;
    for (std::size_t pixelIndex = 0; pixelIndex < numPixels; ++pixelIndex)
    {
        cursorImage->pixels[pixelIndex] = static_cast<Uint32>(pixels[pixelIndex * 4 + 2] +
                                                              (pixels[pixelIndex * 4 + 1] << 8) +
                                                              (pixels[pixelIndex * 4 + 0] << 16) +
                                                              (pixels[pixelIndex * 4 + 3] << 24));
    }

    // Create the cursor.
    m_cursor = XcursorImageLoadCursor(m_display, cursorImage);

    // Free the resources
    XcursorImageDestroy(cursorImage);

    // We assume everything went fine...
    return true;
}